

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O2

Reals __thiscall Omega_h::matrices_to_symms_dim<3>(Omega_h *this,Reals *matrices)

{
  Alloc *pAVar1;
  int n;
  void *extraout_RDX;
  size_t sVar2;
  Reals RVar3;
  allocator local_59;
  type functor;
  Write<double> out;
  Write<double> local_28;
  
  pAVar1 = (matrices->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  n = divide_no_remainder<int>((int)(sVar2 >> 3),9);
  std::__cxx11::string::string((string *)&functor,"",&local_59);
  Write<double>::Write(&out,n * 6,(string *)&functor);
  std::__cxx11::string::~string((string *)&functor);
  Write<double>::Write(&functor.out,&out);
  Write<double>::Write(&functor.matrices.write_,&matrices->write_);
  parallel_for<Omega_h::matrices_to_symms_dim<3>(Omega_h::Read<double>)::_lambda(int)_1_>
            (n,&functor);
  Write<double>::Write(&local_28,&out);
  Read<double>::Read((Read<signed_char> *)this,&local_28);
  Write<double>::~Write(&local_28);
  matrices_to_symms_dim<3>(Omega_h::Read<double>)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)&functor);
  Write<double>::~Write(&out);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals matrices_to_symms_dim(Reals const matrices) {
  constexpr auto ncomps_in = square(dim);
  constexpr auto ncomps_out = symm_ncomps(dim);
  auto const n = divide_no_remainder(matrices.size(), ncomps_in);
  auto const out = Write<Real>(n * ncomps_out);
  auto functor = OMEGA_H_LAMBDA(LO const i) {
    set_symm(out, i, get_matrix<dim, dim>(matrices, i));
  };
  parallel_for(n, std::move(functor));
  return out;
}